

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswread.c
# Opt level: O1

int32_t conv_mcnpx_pdg2ssw(int32_t c)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  int32_t *piVar7;
  long lVar8;
  
  uVar1 = c;
  if (c < 1) {
    uVar1 = -c;
  }
  if (0x3b9b1848 < (int)uVar1) goto LAB_0010394c;
  piVar7 = conv_mcnpx_to_pdg_0to34;
  uVar5 = 0;
  do {
    if (*piVar7 == c) goto LAB_00103942;
    uVar5 = uVar5 + 1;
    piVar7 = piVar7 + 1;
  } while (uVar5 != 0x23);
  uVar5 = 400;
  lVar8 = 0;
  do {
    if (*(uint *)((long)conv_mcnpx_to_pdg_0to34 + lVar8) == -c) goto LAB_00103942;
    uVar3 = (int)uVar5 + 1;
    uVar5 = (ulong)uVar3;
    lVar8 = lVar8 + 4;
  } while (lVar8 != 0x8c);
  bVar2 = true;
LAB_00103944:
  if (!bVar2) {
    return uVar3;
  }
LAB_0010394c:
  iVar4 = 0;
  if (uVar1 + 0xc46535ff < 0x989676) {
    uVar3 = uVar1 / 10 + (uVar1 / 10000) * -1000;
    iVar6 = uVar1 / 10000 + (uVar1 / 10000000) * -1000;
    if (iVar6 - 1U < uVar3 &&
        (uVar1 * -0x33333333 >> 1 | (uint)((uVar1 * -0x33333333 & 1) != 0) << 0x1f) < 0x1999999a) {
      iVar6 = iVar6 * 1000000;
      iVar4 = iVar6 + -0xf408d;
      if (-1 < c) {
        iVar4 = iVar6 + -0xf421d;
      }
      iVar4 = iVar4 + uVar3 * 1000;
    }
  }
  return iVar4;
LAB_00103942:
  uVar3 = (uint)uVar5;
  bVar2 = false;
  goto LAB_00103944;
}

Assistant:

int32_t conv_mcnpx_pdg2ssw( int32_t c )
{
  int32_t absc = c < 0 ? -c : c;
  if (absc <= 1000020040) {
    int i;
    for (i = 0; i<35; ++i) {
      if (conv_mcnpx_to_pdg_0to34[i]==c)
        return i;
    }
    for (i = 0; i<35; ++i) {
      if (conv_mcnpx_to_pdg_0to34[i] == -c)
        return 400+i;
    }
  }
  if (absc>1000000000&&absc<=1009999990) {
    //Ions. PDG format for ions is 10LZZZAAAI, where L!=0 indicates strangeness
    //and I!=0 indicates exited nuclei. We only allow L=I=0 ions here.
    int32_t I = absc % 10;//isomer level
    absc/=10;
    int32_t A = absc%1000;
    absc/=1000;
    int32_t Z = absc % 1000;
    assert(absc/1000==100);//L=0 guaranteed by enclosing condition.
    if ( I || !A || !Z || Z>A )
      return 0;
    return (Z-1)*1000000 + A*1000 + ( c<0 ? 435 : 35 );
  }
  return 0;
}